

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::Dummy(ImVec2 *size)

{
  ImVec2 *lhs;
  ImVec2 local_30;
  undefined1 local_28 [8];
  ImRect bb;
  ImGuiWindow *window;
  ImVec2 *size_local;
  
  bb.Max = (ImVec2)GetCurrentWindow();
  if ((*(bool *)((long)bb.Max + 0x8b) & 1U) == 0) {
    lhs = (ImVec2 *)((long)bb.Max + 0xd8);
    local_30 = operator+(lhs,size);
    ImRect::ImRect((ImRect *)local_28,lhs,&local_30);
    ItemSize(size,-1.0);
    ItemAdd((ImRect *)local_28,0,(ImRect *)0x0);
  }
  return;
}

Assistant:

void ImGui::Dummy(const ImVec2& size)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    ItemSize(size);
    ItemAdd(bb, 0);
}